

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
AlexDataNode(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
             *this,short level,int max_data_node_slots,AlexCompare *comp,
            allocator<std::pair<int,_int>_> *alloc)

{
  (this->super_AlexNode<int,_int>).is_leaf_ = true;
  (this->super_AlexNode<int,_int>).duplication_factor_ = '\0';
  (this->super_AlexNode<int,_int>).level_ = level;
  (this->super_AlexNode<int,_int>).cost_ = 0.0;
  (this->super_AlexNode<int,_int>).model_.a_ = 0.0;
  (this->super_AlexNode<int,_int>).model_.b_ = 0.0;
  (this->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)&PTR__AlexDataNode_00113c38;
  this->key_less_ = comp;
  this->allocator_ = alloc;
  this->next_leaf_ = (self_type *)0x0;
  this->prev_leaf_ = (self_type *)0x0;
  this->key_slots_ = (int *)0x0;
  this->payload_slots_ = (int *)0x0;
  *(undefined8 *)((long)&this->key_slots_ + 4) = 0;
  *(undefined8 *)((long)&this->payload_slots_ + 4) = 0;
  *(undefined8 *)&this->num_keys_ = 0;
  *(undefined8 *)((long)&this->bitmap_ + 4) = 0;
  this->expansion_threshold_ = 1.0;
  this->contraction_threshold_ = 0.0;
  this->max_slots_ = max_data_node_slots;
  this->num_shifts_ = 0;
  this->num_exp_search_iterations_ = 0;
  *(undefined8 *)((long)&this->num_exp_search_iterations_ + 4) = 0;
  this->num_inserts_ = 0;
  this->num_resizes_ = 0;
  this->max_key_ = -0x80000000;
  this->min_key_ = 0x7fffffff;
  this->num_right_out_of_bounds_inserts_ = 0;
  this->num_left_out_of_bounds_inserts_ = 0;
  this->expected_avg_exp_search_iterations_ = 0.0;
  this->expected_avg_shifts_ = 0.0;
  return;
}

Assistant:

AlexDataNode(short level, int max_data_node_slots,
               const Compare& comp = Compare(), const Alloc& alloc = Alloc())
      : AlexNode<T, P>(level, true),
        key_less_(comp),
        allocator_(alloc),
        max_slots_(max_data_node_slots) {}